

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void filter<float>(TWaveformT<float> *waveform,EAudioFilter filterId,float freqCutoff_Hz,
                  int64_t sampleRate)

{
  float *pfVar1;
  float *s;
  float *pfVar2;
  TWaveformT<float> *__range3;
  float fVar3;
  float fVar4;
  TFilterCoefficients local_3c;
  
  if (filterId != None) {
    if (filterId == SecondOrderButterworthHighPass) {
      calculateCoefficientsSecondOrderButterworthHighPass
                (&local_3c,(int)freqCutoff_Hz,(int)sampleRate);
      pfVar1 = (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pfVar2 = (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start; fVar4 = local_3c.ynz1, fVar3 = local_3c.xnz1,
          pfVar2 != pfVar1; pfVar2 = pfVar2 + 1) {
        local_3c.xnz1 = *pfVar2;
        local_3c.ynz1 =
             local_3c.ynz2 * -local_3c.b2 +
             -local_3c.b1 * fVar4 +
             local_3c.xnz2 * local_3c.a2 + local_3c.a0 * local_3c.xnz1 + local_3c.a1 * fVar3;
        *pfVar2 = local_3c.ynz1;
        local_3c.ynz2 = fVar4;
        local_3c.xnz2 = fVar3;
      }
    }
    else {
      if (filterId != FirstOrderHighPass) {
        fprintf(_stderr,"Unknown filter type: %d\n",filterId);
        return;
      }
      calculateCoefficientsFirstOrderHighPass(&local_3c,(int)freqCutoff_Hz,(int)sampleRate);
      pfVar1 = (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pfVar2 = (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start; fVar4 = local_3c.ynz1, fVar3 = local_3c.xnz1,
          pfVar2 != pfVar1; pfVar2 = pfVar2 + 1) {
        local_3c.xnz1 = *pfVar2;
        local_3c.ynz1 =
             local_3c.ynz2 * -local_3c.b2 +
             -local_3c.b1 * fVar4 +
             local_3c.xnz2 * local_3c.a2 + local_3c.a0 * local_3c.xnz1 + local_3c.a1 * fVar3;
        *pfVar2 = local_3c.ynz1;
        local_3c.ynz2 = fVar4;
        local_3c.xnz2 = fVar3;
      }
    }
  }
  return;
}

Assistant:

void filter(TWaveformT<TSample> & waveform, EAudioFilter filterId, float freqCutoff_Hz, int64_t sampleRate) {
    switch (filterId) {
        case EAudioFilter::None:
            {
                return;
            }
            break;
        case EAudioFilter::FirstOrderHighPass:
            {
                auto filterCoefficients = ::calculateCoefficientsFirstOrderHighPass(freqCutoff_Hz, sampleRate);
                for (auto & s : waveform) {
                    s = ::filterFirstOrderHighPass(filterCoefficients, s);
                }
                return;
            }
            break;
        case EAudioFilter::SecondOrderButterworthHighPass:
            {
                auto filterCoefficients = ::calculateCoefficientsSecondOrderButterworthHighPass(freqCutoff_Hz, sampleRate);
                for (auto & s : waveform) {
                    s = ::filterSecondOrderButterworthHighPass(filterCoefficients, s);
                }
                return;
            }
            break;
    }

    fprintf(stderr, "Unknown filter type: %d\n", filterId);
}